

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O0

SimpleTimeZone * __thiscall
icu_63::SimpleTimeZone::operator=(SimpleTimeZone *this,SimpleTimeZone *right)

{
  SimpleTimeZone *right_local;
  SimpleTimeZone *this_local;
  
  if (this != right) {
    TimeZone::operator=((TimeZone *)this,(TimeZone *)right);
    this->rawOffset = right->rawOffset;
    this->startMonth = right->startMonth;
    this->startDay = right->startDay;
    this->startDayOfWeek = right->startDayOfWeek;
    this->startTime = right->startTime;
    this->startTimeMode = right->startTimeMode;
    this->startMode = right->startMode;
    this->endMonth = right->endMonth;
    this->endDay = right->endDay;
    this->endDayOfWeek = right->endDayOfWeek;
    this->endTime = right->endTime;
    this->endTimeMode = right->endTimeMode;
    this->endMode = right->endMode;
    this->startYear = right->startYear;
    this->dstSavings = right->dstSavings;
    this->useDaylight = right->useDaylight;
    clearTransitionRules(this);
  }
  return this;
}

Assistant:

SimpleTimeZone &
SimpleTimeZone::operator=(const SimpleTimeZone &right)
{
    if (this != &right)
    {
        TimeZone::operator=(right);
        rawOffset      = right.rawOffset;
        startMonth     = right.startMonth;
        startDay       = right.startDay;
        startDayOfWeek = right.startDayOfWeek;
        startTime      = right.startTime;
        startTimeMode  = right.startTimeMode;
        startMode      = right.startMode;
        endMonth       = right.endMonth;
        endDay         = right.endDay;
        endDayOfWeek   = right.endDayOfWeek;
        endTime        = right.endTime;
        endTimeMode    = right.endTimeMode;
        endMode        = right.endMode;
        startYear      = right.startYear;
        dstSavings     = right.dstSavings;
        useDaylight    = right.useDaylight;
        clearTransitionRules();
    }
    return *this;
}